

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O3

void Fxu_HeapSingleUpdate(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = pSingle->HNum;
  if (((int)uVar1 < 1) || (p->nItemsAlloc < (int)uVar1)) {
    __assert_fail("(pSingle)->HNum >= 1 && (pSingle)->HNum <= p->nItemsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuHeapS.c"
                  ,0xe4,"void Fxu_HeapSingleUpdate(Fxu_HeapSingle *, Fxu_Single *)");
  }
  if ((uVar1 != 1) && (p->pTree[uVar1 >> 1]->Weight < pSingle->Weight)) {
    Fxu_HeapSingleMoveUp(p,(Fxu_Single *)(ulong)uVar1);
    return;
  }
  uVar2 = uVar1 * 2;
  if (((p->nItems < (int)uVar2) || (p->pTree[(int)uVar2]->Weight <= pSingle->Weight)) &&
     ((p->nItems <= (int)uVar2 || (p->pTree[(int)(uVar2 | 1)]->Weight <= pSingle->Weight)))) {
    return;
  }
  Fxu_HeapSingleMoveDn(p,(Fxu_Single *)(ulong)uVar1);
  return;
}

Assistant:

void Fxu_HeapSingleUpdate( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
	FXU_HEAP_SINGLE_ASSERT(p,pSingle);
	if ( FXU_HEAP_SINGLE_PARENT_EXISTS(p,pSingle) && 
         FXU_HEAP_SINGLE_WEIGHT(pSingle) > FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_PARENT(p,pSingle) ) )
		Fxu_HeapSingleMoveUp( p, pSingle );
	else if ( FXU_HEAP_SINGLE_CHILD1_EXISTS(p,pSingle) && 
        FXU_HEAP_SINGLE_WEIGHT(pSingle) < FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_CHILD1(p,pSingle) ) )
		Fxu_HeapSingleMoveDn( p, pSingle );
	else if ( FXU_HEAP_SINGLE_CHILD2_EXISTS(p,pSingle) && 
        FXU_HEAP_SINGLE_WEIGHT(pSingle) < FXU_HEAP_SINGLE_WEIGHT( FXU_HEAP_SINGLE_CHILD2(p,pSingle) ) )
		Fxu_HeapSingleMoveDn( p, pSingle );
}